

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_copy_and_apply_volume_factor_per_channel_f32
               (float *pFramesOut,float *pFramesIn,ma_uint64 frameCount,ma_uint32 channels,
               float *pChannelGains)

{
  ma_uint32 iChannel;
  ma_uint64 iFrame;
  float *pChannelGains_local;
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  float *pFramesIn_local;
  float *pFramesOut_local;
  
  for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
    for (iChannel = 0; iChannel < channels; iChannel = iChannel + 1) {
      pFramesOut[iFrame * channels + (ulong)iChannel] =
           pFramesIn[iFrame * channels + (ulong)iChannel] * pChannelGains[iChannel];
    }
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_factor_per_channel_f32(float* pFramesOut, const float* pFramesIn, ma_uint64 frameCount, ma_uint32 channels, float* pChannelGains)
{
    ma_uint64 iFrame;

    if (channels == 2) {
        /* TODO: Do an optimized implementation for stereo and mono. Can do a SIMD optimized implementation as well. */
    }

    for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
        ma_uint32 iChannel;
        for (iChannel = 0; iChannel < channels; iChannel += 1) {
            pFramesOut[iFrame * channels + iChannel] = pFramesIn[iFrame * channels + iChannel] * pChannelGains[iChannel];
        }
    }
}